

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

node_ptr __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::get_child(basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            *this,node_type type,uint8_t child_index)

{
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *pkVar1;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x3ac,
                  "node_ptr unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::get_child(node_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  case 1:
  case 4:
    pkVar1 = &this[1].k_prefix + child_index;
    break;
  case 2:
    pkVar1 = &this[2].k_prefix + child_index;
    break;
  case 3:
    if ((ulong)(byte)(&this->field_0x9)[child_index] == 0xff) {
      return (node_ptr)0;
    }
    pkVar1 = &this[0x12].k_prefix + (byte)(&this->field_0x9)[child_index];
    break;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x3ba,"get_child");
  }
  return (node_ptr)*pkVar1;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr node_ptr get_child(
      node_type type, std::uint8_t child_index) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->get_child(child_index);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->get_child(child_index);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->get_child(child_index);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->get_child(child_index);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }